

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::JavaGeneratorTest_Basic_Test::
~JavaGeneratorTest_Basic_Test(JavaGeneratorTest_Basic_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2d0);
  return;
}

Assistant:

TEST_F(JavaGeneratorTest, Basic) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto2";
    message Foo {
      optional int32 bar = 1;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --java_out=$tmpdir foo.proto");

  ExpectNoErrors();
}